

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateEqualsAndHashCode
          (ImmutableMessageGenerator *this,Printer *printer)

{
  long lVar1;
  long lVar2;
  __uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
  _Var3;
  OneofDescriptor *pOVar4;
  bool bVar5;
  Descriptor *pDVar6;
  FieldGeneratorInfo *pFVar7;
  LogMessage *pLVar8;
  long *plVar9;
  OneofGeneratorInfo *pOVar10;
  _Base_ptr p_Var11;
  long lVar12;
  char *pcVar13;
  long lVar14;
  LogMessage local_a0;
  _Base_ptr local_68;
  _Base_ptr local_60;
  OneofDescriptor *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  io::Printer::Print<>(printer,"@java.lang.Override\npublic boolean equals(");
  io::Printer::Print<>(printer,"final java.lang.Object obj) {\n");
  io::Printer::Indent(printer);
  ClassNameResolver::GetClassName_abi_cxx11_
            ((string *)&local_a0,this->name_resolver_,(this->super_MessageGenerator).descriptor_,
             true);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,
             "if (obj == this) {\n return true;\n}\nif (!(obj instanceof $classname$)) {\n  return super.equals(obj);\n}\n$classname$ other = ($classname$) obj;\n\n"
             ,(char (*) [10])0x3e9312,(string *)&local_a0);
  if ((char *)local_a0._0_8_ != (char *)((long)&local_a0 + 0x10U)) {
    operator_delete((void *)local_a0._0_8_);
  }
  pDVar6 = (this->super_MessageGenerator).descriptor_;
  if (0 < *(int *)(pDVar6 + 4)) {
    lVar14 = 0;
    lVar12 = 0;
    do {
      lVar1 = *(long *)(pDVar6 + 0x28);
      if ((((*(byte *)(lVar1 + 1 + lVar14) & 0x10) == 0) ||
          (lVar2 = *(long *)(lVar1 + 0x28 + lVar14), lVar2 == 0)) ||
         ((*(int *)(lVar2 + 4) == 1 && ((*(byte *)(*(long *)(lVar2 + 0x20) + 1) & 2) != 0)))) {
        pFVar7 = Context::GetFieldGeneratorInfo(this->context_,(FieldDescriptor *)(lVar1 + lVar14));
        bVar5 = anon_unknown_27::CheckHasBitsForEqualsAndHashCode
                          ((FieldDescriptor *)(lVar1 + lVar14));
        if (bVar5) {
          io::Printer::Print<char[5],std::__cxx11::string>
                    (printer,
                     "if (has$name$() != other.has$name$()) return false;\nif (has$name$()) {\n",
                     (char (*) [5])0x3ea8a1,&pFVar7->capitalized_name);
          io::Printer::Indent(printer);
          if (*(Descriptor **)(lVar1 + 0x20 + lVar14) != (this->field_generators_).descriptor_) {
            internal::LogMessage::LogMessage
                      (&local_a0,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_field.h"
                       ,0x8a);
            pLVar8 = internal::LogMessage::operator<<
                               (&local_a0,
                                "CHECK failed: (field->containing_type()) == (descriptor_): ");
            internal::LogFinisher::operator=((LogFinisher *)&local_50,pLVar8);
            internal::LogMessage::~LogMessage(&local_a0);
          }
          if ((*(byte *)(lVar1 + 1 + lVar14) & 8) == 0) {
            plVar9 = (long *)(*(long *)(lVar1 + 0x20 + lVar14) + 0x28);
          }
          else {
            lVar2 = *(long *)(lVar1 + 0x28 + lVar14);
            if (lVar2 == 0) {
              plVar9 = (long *)(*(long *)(lVar1 + 0x10 + lVar14) + 0x70);
            }
            else {
              plVar9 = (long *)(lVar2 + 0x50);
            }
          }
          _Var3._M_t.
          super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
          .super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>
          ._M_head_impl =
               (this->field_generators_).field_generators_.
               super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start
               [(int)((ulong)((lVar1 - *plVar9) + lVar14) >> 3) * 0x38e38e39]._M_t.
               super___uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
               ._M_t;
          (**(code **)(*(long *)_Var3._M_t.
                                super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                                .
                                super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>
                                ._M_head_impl + 0x90))
                    (_Var3._M_t.
                     super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                     .
                     super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>
                     ._M_head_impl,printer);
          io::Printer::Outdent(printer);
          io::Printer::Print<>(printer,"}\n");
        }
        else {
          if (*(Descriptor **)(lVar1 + 0x20 + lVar14) != (this->field_generators_).descriptor_) {
            internal::LogMessage::LogMessage
                      (&local_a0,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_field.h"
                       ,0x8a);
            pLVar8 = internal::LogMessage::operator<<
                               (&local_a0,
                                "CHECK failed: (field->containing_type()) == (descriptor_): ");
            internal::LogFinisher::operator=((LogFinisher *)&local_50,pLVar8);
            internal::LogMessage::~LogMessage(&local_a0);
          }
          if ((*(byte *)(lVar1 + 1 + lVar14) & 8) == 0) {
            plVar9 = (long *)(*(long *)(lVar1 + 0x20 + lVar14) + 0x28);
          }
          else {
            lVar2 = *(long *)(lVar1 + 0x28 + lVar14);
            if (lVar2 == 0) {
              plVar9 = (long *)(*(long *)(lVar1 + 0x10 + lVar14) + 0x70);
            }
            else {
              plVar9 = (long *)(lVar2 + 0x50);
            }
          }
          _Var3._M_t.
          super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
          .super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>
          ._M_head_impl =
               (this->field_generators_).field_generators_.
               super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start
               [(int)((ulong)((lVar1 - *plVar9) + lVar14) >> 3) * 0x38e38e39]._M_t.
               super___uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
               ._M_t;
          (**(code **)(*(long *)_Var3._M_t.
                                super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                                .
                                super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>
                                ._M_head_impl + 0x90))
                    (_Var3._M_t.
                     super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                     .
                     super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>
                     ._M_head_impl,printer);
        }
      }
      lVar12 = lVar12 + 1;
      pDVar6 = (this->super_MessageGenerator).descriptor_;
      lVar14 = lVar14 + 0x48;
    } while (lVar12 < *(int *)(pDVar6 + 4));
  }
  p_Var11 = (this->super_MessageGenerator).oneofs_._M_t._M_impl.super__Rb_tree_header._M_header.
            _M_left;
  local_60 = &(this->super_MessageGenerator).oneofs_._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var11 != local_60) {
    do {
      pOVar4 = *(OneofDescriptor **)(p_Var11 + 1);
      local_68 = p_Var11;
      pOVar10 = Context::GetOneofGeneratorInfo(this->context_,pOVar4);
      io::Printer::Print<char[23],std::__cxx11::string>
                (printer,
                 "if (!get$oneof_capitalized_name$Case().equals(other.get$oneof_capitalized_name$Case())) return false;\n"
                 ,(char (*) [23])"oneof_capitalized_name",&pOVar10->capitalized_name);
      pOVar10 = Context::GetOneofGeneratorInfo(this->context_,pOVar4);
      io::Printer::Print<char[11],std::__cxx11::string>
                (printer,"switch ($oneof_name$Case_) {\n",(char (*) [11])0x3f146d,&pOVar10->name);
      io::Printer::Indent(printer);
      if (0 < *(int *)(pOVar4 + 4)) {
        lVar14 = 0;
        lVar12 = 0;
        local_58 = pOVar4;
        do {
          lVar1 = *(long *)(local_58 + 0x20);
          pcVar13 = (char *)((long)&local_a0 + 0x10);
          local_a0._0_8_ = pcVar13;
          local_a0.filename_ = FastInt32ToBufferLeft(*(int32 *)(lVar1 + 4 + lVar14),pcVar13);
          local_a0.filename_ = local_a0.filename_ + -(long)pcVar13;
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,local_a0._0_8_,local_a0.filename_ + local_a0._0_8_);
          io::Printer::Print<char[13],std::__cxx11::string>
                    (printer,"case $field_number$:\n",(char (*) [13])"field_number",&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          io::Printer::Indent(printer);
          if (*(Descriptor **)(lVar1 + 0x20 + lVar14) != (this->field_generators_).descriptor_) {
            internal::LogMessage::LogMessage
                      (&local_a0,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_field.h"
                       ,0x8a);
            pLVar8 = internal::LogMessage::operator<<
                               (&local_a0,
                                "CHECK failed: (field->containing_type()) == (descriptor_): ");
            internal::LogFinisher::operator=((LogFinisher *)&local_50,pLVar8);
            internal::LogMessage::~LogMessage(&local_a0);
          }
          if ((*(byte *)(lVar1 + 1 + lVar14) & 8) == 0) {
            plVar9 = (long *)(*(long *)(lVar1 + 0x20 + lVar14) + 0x28);
          }
          else {
            lVar2 = *(long *)(lVar1 + 0x28 + lVar14);
            if (lVar2 == 0) {
              plVar9 = (long *)(*(long *)(lVar1 + 0x10 + lVar14) + 0x70);
            }
            else {
              plVar9 = (long *)(lVar2 + 0x50);
            }
          }
          _Var3._M_t.
          super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
          .super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>
          ._M_head_impl =
               (this->field_generators_).field_generators_.
               super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start
               [(int)((ulong)((lVar1 - *plVar9) + lVar14) >> 3) * 0x38e38e39]._M_t.
               super___uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
               ._M_t;
          (**(code **)(*(long *)_Var3._M_t.
                                super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                                .
                                super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>
                                ._M_head_impl + 0x90))
                    (_Var3._M_t.
                     super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                     .
                     super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>
                     ._M_head_impl,printer);
          io::Printer::Print<>(printer,"break;\n");
          io::Printer::Outdent(printer);
          lVar12 = lVar12 + 1;
          lVar14 = lVar14 + 0x48;
        } while (lVar12 < *(int *)(local_58 + 4));
      }
      io::Printer::Print<>(printer,"case 0:\ndefault:\n");
      io::Printer::Outdent(printer);
      io::Printer::Print<>(printer,"}\n");
      p_Var11 = (_Base_ptr)std::_Rb_tree_increment(local_68);
    } while (p_Var11 != local_60);
  }
  io::Printer::Print<>(printer,"if (!unknownFields.equals(other.unknownFields)) return false;\n");
  if (0 < *(int *)((this->super_MessageGenerator).descriptor_ + 0x78)) {
    io::Printer::Print<>
              (printer,
               "if (!getExtensionFields().equals(other.getExtensionFields()))\n  return false;\n");
  }
  io::Printer::Print<>(printer,"return true;\n");
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\n\n");
  io::Printer::Print<>(printer,"@java.lang.Override\npublic int hashCode() {\n");
  io::Printer::Indent(printer);
  io::Printer::Print<>(printer,"if (memoizedHashCode != 0) {\n");
  io::Printer::Indent(printer);
  io::Printer::Print<>(printer,"return memoizedHashCode;\n");
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\nint hash = 41;\n");
  pcVar13 = "hash = (19 * hash) + getDescriptor().hashCode();\n";
  if (*(char *)(*(long *)((this->super_MessageGenerator).descriptor_ + 0x20) + 0x49) != '\0') {
    pcVar13 = "hash = (19 * hash) + getDescriptorForType().hashCode();\n";
  }
  io::Printer::Print<>(printer,pcVar13);
  pDVar6 = (this->super_MessageGenerator).descriptor_;
  if (0 < *(int *)(pDVar6 + 4)) {
    lVar14 = 0;
    lVar12 = 0;
    do {
      lVar1 = *(long *)(pDVar6 + 0x28);
      if ((((*(byte *)(lVar1 + 1 + lVar14) & 0x10) == 0) ||
          (lVar2 = *(long *)(lVar1 + 0x28 + lVar14), lVar2 == 0)) ||
         ((*(int *)(lVar2 + 4) == 1 && ((*(byte *)(*(long *)(lVar2 + 0x20) + 1) & 2) != 0)))) {
        pFVar7 = Context::GetFieldGeneratorInfo(this->context_,(FieldDescriptor *)(lVar1 + lVar14));
        bVar5 = anon_unknown_27::CheckHasBitsForEqualsAndHashCode
                          ((FieldDescriptor *)(lVar1 + lVar14));
        if (bVar5) {
          io::Printer::Print<char[5],std::__cxx11::string>
                    (printer,"if (has$name$()) {\n",(char (*) [5])0x3ea8a1,&pFVar7->capitalized_name
                    );
          io::Printer::Indent(printer);
          if (*(Descriptor **)(lVar1 + 0x20 + lVar14) != (this->field_generators_).descriptor_) {
            internal::LogMessage::LogMessage
                      (&local_a0,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_field.h"
                       ,0x8a);
            pLVar8 = internal::LogMessage::operator<<
                               (&local_a0,
                                "CHECK failed: (field->containing_type()) == (descriptor_): ");
            internal::LogFinisher::operator=((LogFinisher *)&local_50,pLVar8);
            internal::LogMessage::~LogMessage(&local_a0);
          }
          if ((*(byte *)(lVar1 + 1 + lVar14) & 8) == 0) {
            plVar9 = (long *)(*(long *)(lVar1 + 0x20 + lVar14) + 0x28);
          }
          else {
            lVar2 = *(long *)(lVar1 + 0x28 + lVar14);
            if (lVar2 == 0) {
              plVar9 = (long *)(*(long *)(lVar1 + 0x10 + lVar14) + 0x70);
            }
            else {
              plVar9 = (long *)(lVar2 + 0x50);
            }
          }
          _Var3._M_t.
          super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
          .super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>
          ._M_head_impl =
               (this->field_generators_).field_generators_.
               super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start
               [(int)((ulong)((lVar1 - *plVar9) + lVar14) >> 3) * 0x38e38e39]._M_t.
               super___uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
               ._M_t;
          (**(code **)(*(long *)_Var3._M_t.
                                super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                                .
                                super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>
                                ._M_head_impl + 0x98))
                    (_Var3._M_t.
                     super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                     .
                     super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>
                     ._M_head_impl,printer);
          io::Printer::Outdent(printer);
          io::Printer::Print<>(printer,"}\n");
        }
        else {
          if (*(Descriptor **)(lVar1 + 0x20 + lVar14) != (this->field_generators_).descriptor_) {
            internal::LogMessage::LogMessage
                      (&local_a0,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_field.h"
                       ,0x8a);
            pLVar8 = internal::LogMessage::operator<<
                               (&local_a0,
                                "CHECK failed: (field->containing_type()) == (descriptor_): ");
            internal::LogFinisher::operator=((LogFinisher *)&local_50,pLVar8);
            internal::LogMessage::~LogMessage(&local_a0);
          }
          if ((*(byte *)(lVar1 + 1 + lVar14) & 8) == 0) {
            plVar9 = (long *)(*(long *)(lVar1 + 0x20 + lVar14) + 0x28);
          }
          else {
            lVar2 = *(long *)(lVar1 + 0x28 + lVar14);
            if (lVar2 == 0) {
              plVar9 = (long *)(*(long *)(lVar1 + 0x10 + lVar14) + 0x70);
            }
            else {
              plVar9 = (long *)(lVar2 + 0x50);
            }
          }
          _Var3._M_t.
          super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
          .super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>
          ._M_head_impl =
               (this->field_generators_).field_generators_.
               super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start
               [(int)((ulong)((lVar1 - *plVar9) + lVar14) >> 3) * 0x38e38e39]._M_t.
               super___uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
               ._M_t;
          (**(code **)(*(long *)_Var3._M_t.
                                super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                                .
                                super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>
                                ._M_head_impl + 0x98))
                    (_Var3._M_t.
                     super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                     .
                     super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>
                     ._M_head_impl,printer);
        }
      }
      lVar12 = lVar12 + 1;
      pDVar6 = (this->super_MessageGenerator).descriptor_;
      lVar14 = lVar14 + 0x48;
    } while (lVar12 < *(int *)(pDVar6 + 4));
  }
  p_Var11 = (this->super_MessageGenerator).oneofs_._M_t._M_impl.super__Rb_tree_header._M_header.
            _M_left;
  if (p_Var11 != local_60) {
    do {
      pOVar4 = *(OneofDescriptor **)(p_Var11 + 1);
      local_68 = p_Var11;
      pOVar10 = Context::GetOneofGeneratorInfo(this->context_,pOVar4);
      io::Printer::Print<char[11],std::__cxx11::string>
                (printer,"switch ($oneof_name$Case_) {\n",(char (*) [11])0x3f146d,&pOVar10->name);
      io::Printer::Indent(printer);
      if (0 < *(int *)(pOVar4 + 4)) {
        lVar14 = 0;
        lVar12 = 0;
        local_58 = pOVar4;
        do {
          lVar1 = *(long *)(local_58 + 0x20);
          pcVar13 = (char *)((long)&local_a0 + 0x10);
          local_a0._0_8_ = pcVar13;
          local_a0.filename_ = FastInt32ToBufferLeft(*(int32 *)(lVar1 + 4 + lVar14),pcVar13);
          local_a0.filename_ = local_a0.filename_ + -(long)pcVar13;
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,local_a0._0_8_,local_a0.filename_ + local_a0._0_8_);
          io::Printer::Print<char[13],std::__cxx11::string>
                    (printer,"case $field_number$:\n",(char (*) [13])"field_number",&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          io::Printer::Indent(printer);
          if (*(Descriptor **)(lVar1 + 0x20 + lVar14) != (this->field_generators_).descriptor_) {
            internal::LogMessage::LogMessage
                      (&local_a0,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_field.h"
                       ,0x8a);
            pLVar8 = internal::LogMessage::operator<<
                               (&local_a0,
                                "CHECK failed: (field->containing_type()) == (descriptor_): ");
            internal::LogFinisher::operator=((LogFinisher *)&local_50,pLVar8);
            internal::LogMessage::~LogMessage(&local_a0);
          }
          if ((*(byte *)(lVar1 + 1 + lVar14) & 8) == 0) {
            plVar9 = (long *)(*(long *)(lVar1 + 0x20 + lVar14) + 0x28);
          }
          else {
            lVar2 = *(long *)(lVar1 + 0x28 + lVar14);
            if (lVar2 == 0) {
              plVar9 = (long *)(*(long *)(lVar1 + 0x10 + lVar14) + 0x70);
            }
            else {
              plVar9 = (long *)(lVar2 + 0x50);
            }
          }
          _Var3._M_t.
          super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
          .super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>
          ._M_head_impl =
               (this->field_generators_).field_generators_.
               super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start
               [(int)((ulong)((lVar1 - *plVar9) + lVar14) >> 3) * 0x38e38e39]._M_t.
               super___uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
               ._M_t;
          (**(code **)(*(long *)_Var3._M_t.
                                super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                                .
                                super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>
                                ._M_head_impl + 0x98))
                    (_Var3._M_t.
                     super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                     .
                     super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>
                     ._M_head_impl,printer);
          io::Printer::Print<>(printer,"break;\n");
          io::Printer::Outdent(printer);
          lVar12 = lVar12 + 1;
          lVar14 = lVar14 + 0x48;
        } while (lVar12 < *(int *)(local_58 + 4));
      }
      io::Printer::Print<>(printer,"case 0:\ndefault:\n");
      io::Printer::Outdent(printer);
      io::Printer::Print<>(printer,"}\n");
      p_Var11 = (_Base_ptr)std::_Rb_tree_increment(local_68);
    } while (p_Var11 != local_60);
    pDVar6 = (this->super_MessageGenerator).descriptor_;
  }
  if (0 < *(int *)(pDVar6 + 0x78)) {
    io::Printer::Print<>(printer,"hash = hashFields(hash, getExtensionFields());\n");
  }
  io::Printer::Print<>(printer,"hash = (29 * hash) + unknownFields.hashCode();\n");
  io::Printer::Print<>(printer,"memoizedHashCode = hash;\nreturn hash;\n");
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\n\n");
  return;
}

Assistant:

void ImmutableMessageGenerator::GenerateEqualsAndHashCode(
    io::Printer* printer) {
  printer->Print(
      "@java.lang.Override\n"
      "public boolean equals(");
  printer->Print("final java.lang.Object obj) {\n");
  printer->Indent();
  printer->Print(
      "if (obj == this) {\n"
      " return true;\n"
      "}\n"
      "if (!(obj instanceof $classname$)) {\n"
      "  return super.equals(obj);\n"
      "}\n"
      "$classname$ other = ($classname$) obj;\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (!IsRealOneof(field)) {
      const FieldGeneratorInfo* info = context_->GetFieldGeneratorInfo(field);
      bool check_has_bits = CheckHasBitsForEqualsAndHashCode(field);
      if (check_has_bits) {
        printer->Print(
            "if (has$name$() != other.has$name$()) return false;\n"
            "if (has$name$()) {\n",
            "name", info->capitalized_name);
        printer->Indent();
      }
      field_generators_.get(field).GenerateEqualsCode(printer);
      if (check_has_bits) {
        printer->Outdent();
        printer->Print("}\n");
      }
    }
  }

  // Compare oneofs.
  for (auto oneof : oneofs_) {
    printer->Print(
        "if (!get$oneof_capitalized_name$Case().equals("
        "other.get$oneof_capitalized_name$Case())) return false;\n",
        "oneof_capitalized_name",
        context_->GetOneofGeneratorInfo(oneof)->capitalized_name);
    printer->Print("switch ($oneof_name$Case_) {\n", "oneof_name",
                   context_->GetOneofGeneratorInfo(oneof)->name);
    printer->Indent();
    for (int j = 0; j < (oneof)->field_count(); j++) {
      const FieldDescriptor* field = (oneof)->field(j);
      printer->Print("case $field_number$:\n", "field_number",
                     StrCat(field->number()));
      printer->Indent();
      field_generators_.get(field).GenerateEqualsCode(printer);
      printer->Print("break;\n");
      printer->Outdent();
    }
    printer->Print(
        "case 0:\n"
        "default:\n");
    printer->Outdent();
    printer->Print("}\n");
  }

  // Always consider unknown fields for equality. This will sometimes return
  // false for non-canonical ordering when running in LITE_RUNTIME but it's
  // the best we can do.
  printer->Print(
      "if (!unknownFields.equals(other.unknownFields)) return false;\n");
  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
        "if (!getExtensionFields().equals(other.getExtensionFields()))\n"
        "  return false;\n");
  }
  printer->Print("return true;\n");
  printer->Outdent();
  printer->Print(
      "}\n"
      "\n");

  printer->Print(
      "@java.lang.Override\n"
      "public int hashCode() {\n");
  printer->Indent();
  printer->Print("if (memoizedHashCode != 0) {\n");
  printer->Indent();
  printer->Print("return memoizedHashCode;\n");
  printer->Outdent();
  printer->Print(
      "}\n"
      "int hash = 41;\n");

  // If we output a getDescriptor() method, use that as it is more efficient.
  if (descriptor_->options().no_standard_descriptor_accessor()) {
    printer->Print("hash = (19 * hash) + getDescriptorForType().hashCode();\n");
  } else {
    printer->Print("hash = (19 * hash) + getDescriptor().hashCode();\n");
  }

  // hashCode non-oneofs.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (!IsRealOneof(field)) {
      const FieldGeneratorInfo* info = context_->GetFieldGeneratorInfo(field);
      bool check_has_bits = CheckHasBitsForEqualsAndHashCode(field);
      if (check_has_bits) {
        printer->Print("if (has$name$()) {\n", "name", info->capitalized_name);
        printer->Indent();
      }
      field_generators_.get(field).GenerateHashCode(printer);
      if (check_has_bits) {
        printer->Outdent();
        printer->Print("}\n");
      }
    }
  }

  // hashCode oneofs.
  for (auto oneof : oneofs_) {
    printer->Print("switch ($oneof_name$Case_) {\n", "oneof_name",
                   context_->GetOneofGeneratorInfo(oneof)->name);
    printer->Indent();
    for (int j = 0; j < (oneof)->field_count(); j++) {
      const FieldDescriptor* field = (oneof)->field(j);
      printer->Print("case $field_number$:\n", "field_number",
                     StrCat(field->number()));
      printer->Indent();
      field_generators_.get(field).GenerateHashCode(printer);
      printer->Print("break;\n");
      printer->Outdent();
    }
    printer->Print(
        "case 0:\n"
        "default:\n");
    printer->Outdent();
    printer->Print("}\n");
  }

  if (descriptor_->extension_range_count() > 0) {
    printer->Print("hash = hashFields(hash, getExtensionFields());\n");
  }

  printer->Print("hash = (29 * hash) + unknownFields.hashCode();\n");
  printer->Print(
      "memoizedHashCode = hash;\n"
      "return hash;\n");
  printer->Outdent();
  printer->Print(
      "}\n"
      "\n");
}